

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O3

Own<kj::_::AdapterPromiseNode<kj::OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close>,_kj::Canceler::AdapterImpl<kj::OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close>_>_>,_kj::_::PromiseDisposer>
 __thiscall
kj::_::PromiseDisposer::
alloc<kj::_::AdapterPromiseNode<kj::OneOf<kj::String,kj::Array<unsigned_char>,kj::WebSocket::Close>,kj::Canceler::AdapterImpl<kj::OneOf<kj::String,kj::Array<unsigned_char>,kj::WebSocket::Close>>>,kj::_::PromiseDisposer,kj::Canceler&,kj::Promise<kj::OneOf<kj::String,kj::Array<unsigned_char>,kj::WebSocket::Close>>>
          (PromiseDisposer *this,Canceler *params,
          Promise<kj::OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close>_> *params_1)

{
  void *pvVar1;
  
  pvVar1 = operator_new(0x400);
  AdapterPromiseNode<kj::OneOf<kj::String,kj::Array<unsigned_char>,kj::WebSocket::Close>,kj::Canceler::AdapterImpl<kj::OneOf<kj::String,kj::Array<unsigned_char>,kj::WebSocket::Close>>>
  ::
  AdapterPromiseNode<kj::Canceler&,kj::Promise<kj::OneOf<kj::String,kj::Array<unsigned_char>,kj::WebSocket::Close>>>
            ((AdapterPromiseNode<kj::OneOf<kj::String,kj::Array<unsigned_char>,kj::WebSocket::Close>,kj::Canceler::AdapterImpl<kj::OneOf<kj::String,kj::Array<unsigned_char>,kj::WebSocket::Close>>>
              *)((long)pvVar1 + 0x1e8),params,params_1);
  *(void **)((long)pvVar1 + 0x1f0) = pvVar1;
  *(AdapterPromiseNode<kj::OneOf<kj::String,kj::Array<unsigned_char>,kj::WebSocket::Close>,kj::Canceler::AdapterImpl<kj::OneOf<kj::String,kj::Array<unsigned_char>,kj::WebSocket::Close>>>
    **)this = (AdapterPromiseNode<kj::OneOf<kj::String,kj::Array<unsigned_char>,kj::WebSocket::Close>,kj::Canceler::AdapterImpl<kj::OneOf<kj::String,kj::Array<unsigned_char>,kj::WebSocket::Close>>>
               *)((long)pvVar1 + 0x1e8);
  return (Own<kj::_::AdapterPromiseNode<kj::OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close>,_kj::Canceler::AdapterImpl<kj::OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close>_>_>,_kj::_::PromiseDisposer>
          )(AdapterPromiseNode<kj::OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close>,_kj::Canceler::AdapterImpl<kj::OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close>_>_>
            *)this;
}

Assistant:

static kj::Own<T, D> alloc(Params&&... params) noexcept {
    // Implements allocPromise().
    T* ptr;
    if (!canArenaAllocate<T>()) {
      // Node too big (or needs weird alignment), fall back to regular heap allocation.
      ptr = new T(kj::fwd<Params>(params)...);
    } else {
      // Start a new arena.
      //
      // NOTE: As in appendPromise() (below), we don't implement exception-safety because it causes
      //   code bloat and these constructors probably don't throw. Instead this function is
      //   noexcept, so if a constructor does throw, it'll crash rather than leak memory.
      auto* arena = new PromiseArena;
      ptr = reinterpret_cast<T*>(arena + 1) - 1;
      ctor(*ptr, kj::fwd<Params>(params)...);
      ptr->arena = arena;
      KJ_IREQUIRE(reinterpret_cast<void*>(ptr) ==
                  reinterpret_cast<void*>(static_cast<PromiseArenaMember*>(ptr)),
          "PromiseArenaMember must be the leftmost inherited type.");
    }
    return kj::Own<T, D>(ptr);
  }